

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O2

int av1_get_mvpred_sse(MV_COST_PARAMS *mv_cost_params,FULLPEL_MV best_mv,aom_variance_fn_ptr_t *vfp,
                      buf_2d *src,buf_2d *pre)

{
  uint uVar1;
  undefined4 in_EAX;
  int iVar2;
  uint sse;
  MV mv;
  undefined8 local_28;
  
  local_28 = CONCAT44((int)best_mv * 8,in_EAX) & 0xfff8fff8ffffffff;
  (*vfp->vf)(src->buf,src->stride,
             pre->buf + (((int)best_mv >> 0x10) + (int)best_mv.row * pre->stride),pre->stride,
             (uint *)&local_28);
  uVar1 = (uint)local_28;
  iVar2 = mv_err_cost_((MV *)((long)&local_28 + 4),mv_cost_params);
  return iVar2 + uVar1;
}

Assistant:

int av1_get_mvpred_sse(const MV_COST_PARAMS *mv_cost_params,
                       const FULLPEL_MV best_mv,
                       const aom_variance_fn_ptr_t *vfp,
                       const struct buf_2d *src, const struct buf_2d *pre) {
  const MV mv = get_mv_from_fullmv(&best_mv);
  unsigned int sse, var;

  var = vfp->vf(src->buf, src->stride, get_buf_from_fullmv(pre, &best_mv),
                pre->stride, &sse);
  (void)var;

  return sse + mv_err_cost_(&mv, mv_cost_params);
}